

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O1

void __thiscall
irr::video::COpenGL3DriverBase::deleteHardwareBuffer
          (COpenGL3DriverBase *this,SHWBufferLink *_HWBuffer)

{
  GLuint *pGVar1;
  
  if (_HWBuffer != (SHWBufferLink *)0x0) {
    if (*(int *)&_HWBuffer[1]._vptr_SHWBufferLink != 0) {
      (*GL.DeleteBuffers)(1,(GLuint *)(_HWBuffer + 1));
      *(GLuint *)&_HWBuffer[1]._vptr_SHWBufferLink = 0;
    }
    if (*(int *)((long)&_HWBuffer[1]._vptr_SHWBufferLink + 4) != 0) {
      pGVar1 = (GLuint *)((long)&_HWBuffer[1]._vptr_SHWBufferLink + 4);
      (*GL.DeleteBuffers)(1,pGVar1);
      *pGVar1 = 0;
    }
    CNullDriver::deleteHardwareBuffer(&this->super_CNullDriver,_HWBuffer);
    return;
  }
  return;
}

Assistant:

void COpenGL3DriverBase::deleteHardwareBuffer(SHWBufferLink *_HWBuffer)
{
	if (!_HWBuffer)
		return;

	SHWBufferLink_opengl *HWBuffer = static_cast<SHWBufferLink_opengl *>(_HWBuffer);
	if (HWBuffer->vbo_verticesID) {
		GL.DeleteBuffers(1, &HWBuffer->vbo_verticesID);
		HWBuffer->vbo_verticesID = 0;
	}
	if (HWBuffer->vbo_indicesID) {
		GL.DeleteBuffers(1, &HWBuffer->vbo_indicesID);
		HWBuffer->vbo_indicesID = 0;
	}

	CNullDriver::deleteHardwareBuffer(_HWBuffer);
}